

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

size_t RVO::linearProgram2(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,float radius,
                          Vector2 *optVelocity,bool directionOpt,Vector2 *result)

{
  float fVar1;
  pointer pLVar2;
  Vector2 VVar3;
  bool bVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  size_t i;
  ulong lineNo;
  long lVar6;
  Vector2 VVar7;
  
  fVar1 = optVelocity->x_;
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    if (fVar1 * fVar1 + optVelocity->y_ * optVelocity->y_ <= radius * radius) {
      *result = *optVelocity;
      goto LAB_00107476;
    }
    VVar7 = normalize(optVelocity);
  }
  else {
    VVar7.y_ = optVelocity->y_;
    VVar7.x_ = fVar1;
  }
  VVar3.y_ = radius * VVar7.y_;
  VVar3.x_ = radius * VVar7.x_;
  *result = VVar3;
LAB_00107476:
  lVar6 = 0xc;
  lineNo = 0;
  do {
    pLVar2 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pLVar2 >> 4;
    if (uVar5 <= lineNo) {
      return uVar5;
    }
    if (0.0 < (*(float *)((long)pLVar2 + lVar6 + -8) - result->y_) *
              *(float *)((long)pLVar2 + lVar6 + -4) -
              (*(float *)((long)pLVar2 + lVar6 + -0xc) - result->x_) *
              *(float *)((long)&(pLVar2->point).x_ + lVar6)) {
      VVar7 = *result;
      bVar4 = linearProgram1(lines,lineNo,radius,optVelocity,directionOpt,result);
      if (!bVar4) {
        *result = VVar7;
        return lineNo;
      }
    }
    lineNo = lineNo + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

size_t linearProgram2(const std::vector<Line> &lines, float radius, const Vector2 &optVelocity, bool directionOpt, Vector2 &result)
	{
		if (directionOpt) {
			/*
			 * Optimize direction. Note that the optimization velocity is of unit
			 * length in this case.
			 */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector2 tempResult = result;

				if (!linearProgram1(lines, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return lines.size();
	}